

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::Init(NodeSet *this)

{
  int *piVar1;
  int *v;
  uint32_t i;
  ulong uVar2;
  
  v = (this->table_).ptr_;
  piVar1 = (this->table_).space_;
  if (v != piVar1) {
    base_internal::LowLevelAlloc::Free(v);
  }
  (this->table_).ptr_ = piVar1;
  (this->table_).size_ = 8;
  (this->table_).capacity_ = 8;
  uVar2 = 0;
  do {
    (this->table_).space_[uVar2] = -1;
    uVar2 = uVar2 + 1;
  } while (uVar2 < (this->table_).size_);
  this->occupied_ = 0;
  return;
}

Assistant:

void Init() {
    table_.clear();
    table_.resize(kInline);
    table_.fill(kEmpty);
    occupied_ = 0;
  }